

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O1

void __thiscall MemoryFile_CrazyWriteSize_Test::TestBody(MemoryFile_CrazyWriteSize_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  AssertionResult gtest_ar;
  TrueWithString gtest_msg;
  buffer buffer;
  in_memory mf;
  AssertHelper aAStack_c8 [2];
  Message local_b8 [4];
  shared_ptr<void> local_98;
  long local_88 [2];
  undefined4 local_74;
  MemoryFile local_70;
  in_memory local_60;
  not_null<const_void_*> local_28;
  
  anon_unknown.dwarf_1432f::MemoryFile::make_buffer(&local_70,10);
  *(undefined2 *)(local_70.super_Test._vptr_Test + 1) = 0;
  *local_70.super_Test._vptr_Test = (_func_int *)0x0;
  local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_70.super_Test._vptr_Test;
  local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_70.super_Test.gtest_flag_saver_._M_t.
       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  if ((_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)
      local_70.super_Test.gtest_flag_saver_._M_t.
      super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
      .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)
                ((long)local_70.super_Test.gtest_flag_saver_._M_t.
                       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                       _M_head_impl + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)
                     ((long)local_70.super_Test.gtest_flag_saver_._M_t.
                            super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                            _M_head_impl + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)
                ((long)local_70.super_Test.gtest_flag_saver_._M_t.
                       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                       _M_head_impl + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)
                     ((long)local_70.super_Test.gtest_flag_saver_._M_t.
                            super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                            .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                            _M_head_impl + 8))->_M_dataplus)._M_p + 1;
    }
  }
  pstore::file::in_memory::in_memory(&local_60,&local_98,10,0,true);
  if ((GTestFlagSaver *)
      local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8;
  local_b8[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  pstore::gsl::not_null<const_void_*>::ensure_invariant((not_null<const_void_*> *)&local_98);
  (*local_60.super_file_base._vptr_file_base[0xe])
            (&local_60,local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,4);
  pstore::file::in_memory::seek(&local_60,4);
  std::_V2::generic_category();
  local_74 = 0x16;
  local_88[1] = 0;
  local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88[0] = 0;
  local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_28.ptr_ = "Hello";
    pstore::gsl::not_null<const_void_*>::ensure_invariant(&local_28);
    pstore::file::in_memory::write_buffer(&local_60,local_28,0xfffffffffffffffd);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_98,0,
             (char *)local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ,0x1a5b0e);
  testing::Message::Message(local_b8);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  testing::internal::AssertHelper::operator=(aAStack_c8,local_b8);
  testing::internal::AssertHelper::~AssertHelper(aAStack_c8);
  if ((long *)CONCAT44(local_b8[0].ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_b8[0].ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b8[0].ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_b8[0].ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  if ((long *)local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_88) {
    operator_delete(local_98.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_88[0] + 1);
  }
  if (local_60.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pstore::file::file_base::~file_base(&local_60.super_file_base);
  if (local_70.super_Test.gtest_flag_saver_._M_t.
      super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
      .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.super_Test.gtest_flag_saver_._M_t.
               super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

TEST_F (MemoryFile, CrazyWriteSize) {
    constexpr std::size_t elements = 10;
    auto buffer = MemoryFile::make_buffer (elements);
    std::fill (buffer.get (), buffer.get () + elements, std::uint8_t{0});
    pstore::file::in_memory mf (buffer, elements);

    mf.write (std::numeric_limits<std::uint32_t>::max ());
    mf.seek (4);
    constexpr auto length = std::numeric_limits<std::size_t>::max () - std::size_t{2};
    char const * source = "Hello";
    check_for_error ([&] { mf.write_buffer (source, length); }, std::errc::invalid_argument);
}